

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_tree_element_base
              (nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
              nk_collapse_states initial_state,int *selected,char *hash,int len,int line)

{
  nk_style_selectable *style;
  int *piVar1;
  nk_vec2 nVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_user_font *pnVar5;
  nk_rect r;
  nk_rect rect;
  char *str;
  nk_hash name;
  int iVar6;
  nk_widget_layout_states nVar7;
  int iVar8;
  nk_uint *pnVar9;
  long lVar10;
  nk_table *pnVar11;
  ulong uVar12;
  long lVar13;
  nk_command_buffer *b;
  nk_context *in;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect header;
  nk_flags local_94;
  nk_panel *local_90;
  float local_88;
  float local_84;
  float local_80;
  nk_flags ws;
  int *local_78;
  char *local_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  nk_image *local_50;
  undefined1 local_48 [16];
  
  local_90 = (nk_panel *)CONCAT44(local_90._4_4_,type);
  pnVar3 = ctx->current;
  local_70 = title;
  local_50 = img;
  if (hash == (char *)0x0) {
    len = nk_strlen(title);
    hash = title;
  }
  name = nk_murmur_hash(hash,len,line);
  pnVar11 = pnVar3->tables;
  do {
    if (pnVar11 == (nk_table *)0x0) {
      pnVar9 = nk_add_value(ctx,pnVar3,name,0);
      *pnVar9 = initial_state;
LAB_0013352e:
      iVar6 = nk_strlen(local_70);
      header.x = 0.0;
      header.y = 0.0;
      header.w = 0.0;
      header.h = 0.0;
      ws = 0;
      if (ctx == (nk_context *)0x0) {
        __assert_fail("ctx",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x47da,
                      "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                     );
      }
      pnVar3 = ctx->current;
      local_78 = selected;
      if (pnVar3 == (nk_window *)0x0) {
        __assert_fail("ctx->current",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x47db,
                      "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                     );
      }
      pnVar4 = pnVar3->layout;
      if (pnVar4 == (nk_panel *)0x0) {
        __assert_fail("ctx->current->layout",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                      ,0x47dc,
                      "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                     );
      }
      b = &pnVar3->buffer;
      local_88 = (ctx->style).window.spacing.x;
      local_84 = (ctx->style).window.spacing.y;
      local_80 = (ctx->style).selectable.padding.x;
      fVar14 = (ctx->style).tab.padding.y;
      fVar14 = fVar14 + fVar14 + ((ctx->style).font)->height;
      _local_68 = CONCAT44(fStack_64,fVar14);
      nk_layout_set_min_row_height(ctx,fVar14);
      nk_row_layout(ctx,NK_DYNAMIC,local_68,1,0);
      nk_layout_reset_min_row_height(ctx);
      nVar7 = nk_widget(&header,ctx);
      if ((int)local_90 == 1) {
        if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
          r.y = header.y;
          r.x = header.x;
          r.w = header.w;
          r.h = header.h;
          nk_draw_image(b,r,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
        }
        else {
          rect.y = header.y;
          rect.x = header.x;
          rect.w = header.w;
          rect.h = header.h;
          nk_fill_rect(b,rect,0.0,(ctx->style).tab.border_color);
          fVar14 = (ctx->style).tab.border;
          auVar18._4_4_ = header.h;
          auVar18._0_4_ = header.w;
          rect_00.x = fVar14 + header.x;
          rect_00.y = fVar14 + header.y;
          fVar14 = fVar14 + fVar14;
          auVar17._4_4_ = fVar14;
          auVar17._0_4_ = fVar14;
          auVar17._8_4_ = fVar14;
          auVar17._12_4_ = fVar14;
          auVar18._8_8_ = 0;
          auVar18 = maxps(auVar17,auVar18);
          rect_00.w = auVar18._0_4_ - fVar14;
          rect_00.h = auVar18._4_4_ - fVar14;
          nk_fill_rect(b,rect_00,(ctx->style).tab.rounding,(ctx->style).tab.background.data.color);
        }
        lVar10 = 0x17c8;
        lVar13 = 0x1878;
      }
      else {
        lVar10 = 0x1928;
        lVar13 = 0x19d8;
      }
      in = (nk_context *)0x0;
      if (nVar7 == NK_WIDGET_VALID && (pnVar4->flags & 0x1000) == 0) {
        in = ctx;
      }
      if (*pnVar9 == 1) {
        lVar13 = lVar10;
      }
      pnVar5 = (ctx->style).font;
      fVar14 = pnVar5->height;
      nVar2 = (ctx->style).tab.padding;
      bounds.x = nVar2.x + header.x;
      bounds.y = nVar2.y + header.y;
      local_48 = ZEXT416((uint)fVar14);
      bounds.h = fVar14;
      bounds.w = fVar14;
      uStack_60 = 0;
      local_90 = pnVar4;
      local_68 = bounds.x;
      fStack_64 = bounds.y;
      iVar8 = nk_do_button_symbol(&ws,b,bounds,(&(ctx->style).tab.sym_minimize)[*pnVar9 == 1],
                                  NK_BUTTON_DEFAULT,
                                  (nk_style_button *)
                                  ((long)&(ctx->input).keyboard.keys[0].down + lVar13),&in->input,
                                  pnVar5);
      str = local_70;
      if (iVar8 != 0) {
        *pnVar9 = (uint)(*pnVar9 != 1);
      }
      style = &(ctx->style).selectable;
      local_94 = 0;
      iVar8 = nk_strlen(local_70);
      pnVar5 = (ctx->style).font;
      fVar15 = (*pnVar5->width)(pnVar5->userdata,pnVar5->height,str,iVar8);
      fVar15 = local_80 * 4.0 + fVar15;
      fVar14 = local_88 + (float)local_48._0_4_;
      if (local_88 + (float)local_48._0_4_ <= header.w) {
        fVar14 = header.w;
      }
      fVar19 = (float)local_48._0_4_ + local_68 + local_88;
      fVar16 = fVar14 - (local_84 + (float)local_48._0_4_ + (ctx->style).tab.indent);
      if (fVar15 <= fVar16) {
        fVar16 = fVar15;
      }
      pnVar5 = (ctx->style).font;
      header.w = fVar14;
      if (local_50 == (nk_image *)0x0) {
        bounds_00.y = fStack_64;
        bounds_00.x = fVar19;
        bounds_00.w = fVar16;
        bounds_00.h = pnVar5->height;
        nk_do_selectable(&local_94,b,bounds_00,str,iVar6,0x11,local_78,style,&in->input,pnVar5);
      }
      else {
        nk_do_selectable_image
                  (&local_94,b,
                   (nk_rect)CONCAT88(CONCAT44(pnVar5->height,fVar16),CONCAT44(fStack_64,fVar19)),str
                   ,iVar6,0x11,local_78,local_50,style,&in->input,pnVar5);
      }
      iVar6 = 0;
      if (*pnVar9 == 1) {
        fVar14 = (ctx->style).tab.indent;
        local_90->at_x = (float)*local_90->offset_x + header.x + fVar14;
        fVar15 = (local_90->bounds).w;
        fVar16 = fVar14;
        if (fVar14 <= fVar15) {
          fVar16 = fVar15;
        }
        (local_90->bounds).w = fVar16 - (fVar14 + (ctx->style).window.padding.x);
        piVar1 = &(local_90->row).tree_depth;
        *piVar1 = *piVar1 + 1;
        iVar6 = 1;
      }
      return iVar6;
    }
    uVar12 = (ulong)pnVar11->size;
    if (uVar12 != 0) {
      pnVar9 = pnVar11->values;
      do {
        if (pnVar9[-0x3b] == name) {
          pnVar11->seq = pnVar3->seq;
          goto LAB_0013352e;
        }
        pnVar9 = pnVar9 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    pnVar11 = pnVar11->next;
  } while( true );
}

Assistant:

NK_INTERN int
nk_tree_element_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
    int *selected, const char *hash, int len, int line)
{
    struct nk_window *win = ctx->current;
    int title_len = 0;
    nk_hash tree_hash = 0;
    nk_uint *state = 0;

    /* retrieve tree state from internal widget state tables */
    if (!hash) {
        title_len = (int)nk_strlen(title);
        tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
    } else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
    state = nk_find_value(win, tree_hash);
    if (!state) {
        state = nk_add_value(ctx, win, tree_hash, 0);
        *state = initial_state;
    } return nk_tree_element_image_push_hashed_base(ctx, type, img, title,
        nk_strlen(title), (enum nk_collapse_states*)state, selected);
}